

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float __y;
  uint uVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  float *pfVar9;
  undefined1 (*pauVar10) [16];
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128 afVar16;
  binary_op_pow op;
  int local_c0;
  __m128 _p;
  __m128 _b0;
  
  uVar1 = a->c;
  iVar13 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  local_c0 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    local_c0 = 0;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (uVar11 = 0; uVar11 != uVar1; uVar11 = uVar11 + 1) {
      pvVar2 = a->data;
      sVar3 = a->elemsize;
      sVar4 = a->cstep;
      pfVar9 = (float *)(sVar4 * uVar11 * sVar3 + (long)pvVar2);
      __y = *b->data;
      pvVar5 = c->data;
      sVar6 = c->elemsize;
      sVar7 = c->cstep;
      pauVar10 = (undefined1 (*) [16])(sVar7 * uVar11 * sVar6 + (long)pvVar5);
      lVar12 = 0;
      _b0[0] = __y;
      _b0[1] = __y;
      _b0[2] = __y;
      _b0[3] = __y;
      for (iVar14 = 0; iVar14 + 3 < iVar13; iVar14 = iVar14 + 4) {
        _p._0_8_ = *(undefined8 *)pfVar9;
        _p._8_8_ = *(undefined8 *)(pfVar9 + 2);
        afVar16 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_p,&_b0);
        auVar8._8_4_ = extraout_XMM0_Dc;
        auVar8._0_8_ = afVar16._0_8_;
        auVar8._12_4_ = extraout_XMM0_Dd;
        *pauVar10 = auVar8;
        pfVar9 = pfVar9 + 4;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 4;
      }
      for (; (int)lVar12 < iVar13; lVar12 = lVar12 + 1) {
        fVar15 = powf(*(float *)((long)pvVar2 + lVar12 * 4 + sVar4 * sVar3 * uVar11),__y);
        *(float *)((long)pvVar5 + lVar12 * 4 + sVar7 * sVar6 * uVar11) = fVar15;
      }
    }
  }
  return local_c0;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}